

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O1

void aom_highbd_lpf_vertical_4_dual_sse2
               (uint16_t *s,int p,uint8_t *blimit0,uint8_t *limit0,uint8_t *thresh0,uint8_t *blimit1
               ,uint8_t *limit1,uint8_t *thresh1,int bd)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [12];
  undefined1 auVar60 [12];
  undefined1 auVar61 [12];
  undefined1 auVar62 [12];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [12];
  undefined1 auVar70 [12];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  short sVar83;
  undefined1 auVar84 [16];
  short sVar85;
  undefined4 uVar86;
  undefined1 auVar88 [16];
  short sVar89;
  undefined4 uVar90;
  undefined1 auVar92 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  short sVar103;
  undefined1 auVar99 [16];
  short sVar102;
  short sVar104;
  undefined1 auVar100 [16];
  undefined8 uVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  ushort uVar142;
  ushort uVar146;
  ushort uVar147;
  ushort uVar148;
  ushort uVar149;
  ushort uVar150;
  ushort uVar151;
  undefined1 auVar143 [16];
  ushort uVar152;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar87 [12];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar91 [12];
  undefined1 auVar101 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  short sVar121;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  
  uVar1 = *(ulong *)(s + -2);
  uVar105 = *(undefined8 *)(s + (long)p + -2);
  auVar129._8_4_ = 0;
  auVar129._0_8_ = uVar1;
  auVar129._12_2_ = (short)(uVar1 >> 0x30);
  auVar129._14_2_ = (short)((ulong)uVar105 >> 0x30);
  auVar135._12_4_ = auVar129._12_4_;
  auVar135._8_2_ = 0;
  auVar135._0_8_ = uVar1;
  auVar135._10_2_ = (short)((ulong)uVar105 >> 0x20);
  auVar98._10_6_ = auVar135._10_6_;
  auVar98._8_2_ = (short)(uVar1 >> 0x20);
  auVar98._0_8_ = uVar1;
  auVar59._4_8_ = auVar98._8_8_;
  auVar59._2_2_ = (short)((ulong)uVar105 >> 0x10);
  auVar59._0_2_ = (short)(uVar1 >> 0x10);
  auVar97._0_4_ = CONCAT22((short)uVar105,(short)uVar1);
  auVar97._4_12_ = auVar59;
  uVar1 = *(ulong *)(s + (long)(p * 2) + -2);
  auVar129 = *(undefined1 (*) [16])blimit0;
  uVar105 = *(undefined8 *)(s + (long)(p * 3) + -2);
  auVar113._8_4_ = 0;
  auVar113._0_8_ = uVar1;
  auVar113._12_2_ = (short)(uVar1 >> 0x30);
  auVar113._14_2_ = (short)((ulong)uVar105 >> 0x30);
  auVar143._12_4_ = auVar113._12_4_;
  auVar143._8_2_ = 0;
  auVar143._0_8_ = uVar1;
  auVar143._10_2_ = (short)((ulong)uVar105 >> 0x20);
  auVar141._10_6_ = auVar143._10_6_;
  auVar141._8_2_ = (short)(uVar1 >> 0x20);
  auVar141._0_8_ = uVar1;
  auVar60._4_8_ = auVar141._8_8_;
  auVar60._2_2_ = (short)((ulong)uVar105 >> 0x10);
  auVar60._0_2_ = (short)(uVar1 >> 0x10);
  auVar106._6_2_ = (short)uVar105;
  auVar106._4_2_ = (short)uVar1;
  auVar123 = *(undefined1 (*) [16])blimit1;
  auVar128 = ZEXT416(bd - 8);
  uVar1 = *(ulong *)(s + (long)(p * 4) + -2);
  auVar113 = *(undefined1 (*) [16])limit0;
  uVar105 = *(undefined8 *)(s + (long)(p * 5) + -2);
  auVar95._8_4_ = 0;
  auVar95._0_8_ = uVar1;
  auVar95._12_2_ = (short)(uVar1 >> 0x30);
  auVar95._14_2_ = (short)((ulong)uVar105 >> 0x30);
  auVar94._12_4_ = auVar95._12_4_;
  auVar94._8_2_ = 0;
  auVar94._0_8_ = uVar1;
  auVar94._10_2_ = (short)((ulong)uVar105 >> 0x20);
  auVar93._10_6_ = auVar94._10_6_;
  auVar93._8_2_ = (short)(uVar1 >> 0x20);
  auVar93._0_8_ = uVar1;
  auVar61._4_8_ = auVar93._8_8_;
  auVar61._2_2_ = (short)((ulong)uVar105 >> 0x10);
  auVar61._0_2_ = (short)(uVar1 >> 0x10);
  auVar92._0_4_ = CONCAT22((short)uVar105,(short)uVar1);
  auVar92._4_12_ = auVar61;
  auVar118 = *(undefined1 (*) [16])limit1;
  uVar1 = *(ulong *)(s + (long)(p * 6) + -2);
  auVar107 = *(undefined1 (*) [16])thresh0;
  uVar105 = *(undefined8 *)(s + (long)(p * 7) + -2);
  auVar134._8_4_ = 0;
  auVar134._0_8_ = uVar1;
  auVar134._12_2_ = (short)(uVar1 >> 0x30);
  auVar134._14_2_ = (short)((ulong)uVar105 >> 0x30);
  auVar133._12_4_ = auVar134._12_4_;
  auVar133._8_2_ = 0;
  auVar133._0_8_ = uVar1;
  auVar133._10_2_ = (short)((ulong)uVar105 >> 0x20);
  auVar132._10_6_ = auVar133._10_6_;
  auVar132._8_2_ = (short)(uVar1 >> 0x20);
  auVar132._0_8_ = uVar1;
  auVar62._4_8_ = auVar132._8_8_;
  auVar62._2_2_ = (short)((ulong)uVar105 >> 0x10);
  auVar62._0_2_ = (short)(uVar1 >> 0x10);
  auVar106._14_2_ = (short)uVar105;
  auVar106._12_2_ = (short)uVar1;
  auVar111._0_8_ = auVar97._0_8_;
  auVar111._8_4_ = auVar59._0_4_;
  auVar111._12_4_ = auVar60._0_4_;
  auVar106._0_4_ = auVar97._0_4_;
  auVar136._0_8_ = auVar92._0_8_;
  auVar136._8_4_ = auVar61._0_4_;
  auVar136._12_4_ = auVar62._0_4_;
  auVar106._8_4_ = auVar92._0_4_;
  auVar112._8_8_ = auVar136._8_8_;
  auVar112._0_8_ = auVar111._8_8_;
  auVar137._0_8_ = CONCAT44(auVar141._8_4_,auVar98._8_4_);
  auVar137._8_4_ = auVar135._12_4_;
  auVar137._12_4_ = auVar143._12_4_;
  auVar96._0_8_ = CONCAT44(auVar132._8_4_,auVar93._8_4_);
  auVar96._8_4_ = auVar94._12_4_;
  auVar96._12_4_ = auVar133._12_4_;
  auVar88._8_8_ = auVar96._0_8_;
  auVar88._0_8_ = auVar137._0_8_;
  auVar84._8_8_ = auVar96._8_8_;
  auVar84._0_8_ = auVar137._8_8_;
  auVar97 = psubusw(auVar88,auVar112);
  auVar141 = psubusw(auVar112,auVar88);
  auVar98 = psubusw(auVar84,auVar106);
  auVar137 = psubusw(auVar106,auVar84);
  auVar137 = auVar137 | auVar98;
  auVar98 = psubusw(auVar106,auVar112);
  auVar143 = psubusw(auVar112,auVar106);
  auVar143 = auVar143 | auVar98;
  auVar135 = psubusw(auVar84,auVar88);
  auVar98 = psubusw(auVar88,auVar84);
  auVar98 = auVar98 | auVar135;
  auVar18[0xd] = 0;
  auVar18._0_13_ = auVar129._0_13_;
  auVar18[0xe] = auVar129[7];
  auVar24[0xc] = auVar129[6];
  auVar24._0_12_ = auVar129._0_12_;
  auVar24._13_2_ = auVar18._13_2_;
  auVar30[0xb] = 0;
  auVar30._0_11_ = auVar129._0_11_;
  auVar30._12_3_ = auVar24._12_3_;
  auVar36[10] = auVar129[5];
  auVar36._0_10_ = auVar129._0_10_;
  auVar36._11_4_ = auVar30._11_4_;
  auVar42[9] = 0;
  auVar42._0_9_ = auVar129._0_9_;
  auVar42._10_5_ = auVar36._10_5_;
  auVar48[8] = auVar129[4];
  auVar48._0_8_ = auVar129._0_8_;
  auVar48._9_6_ = auVar42._9_6_;
  auVar63._7_8_ = 0;
  auVar63._0_7_ = auVar48._8_7_;
  auVar71._1_8_ = SUB158(auVar63 << 0x40,7);
  auVar71[0] = auVar129[3];
  auVar71._9_6_ = 0;
  auVar72._1_10_ = SUB1510(auVar71 << 0x30,5);
  auVar72[0] = auVar129[2];
  auVar72._11_4_ = 0;
  auVar58._3_12_ = SUB1512(auVar72 << 0x20,3);
  auVar58[2] = auVar129[1];
  auVar58[1] = 0;
  auVar58[0] = auVar129[0];
  auVar13[0xd] = 0;
  auVar13._0_13_ = auVar123._0_13_;
  auVar13[0xe] = auVar123[7];
  auVar19[0xc] = auVar123[6];
  auVar19._0_12_ = auVar123._0_12_;
  auVar19._13_2_ = auVar13._13_2_;
  auVar25[0xb] = 0;
  auVar25._0_11_ = auVar123._0_11_;
  auVar25._12_3_ = auVar19._12_3_;
  auVar31[10] = auVar123[5];
  auVar31._0_10_ = auVar123._0_10_;
  auVar31._11_4_ = auVar25._11_4_;
  auVar37[9] = 0;
  auVar37._0_9_ = auVar123._0_9_;
  auVar37._10_5_ = auVar31._10_5_;
  auVar43[8] = auVar123[4];
  auVar43._0_8_ = auVar123._0_8_;
  auVar43._9_6_ = auVar37._9_6_;
  auVar64._7_8_ = 0;
  auVar64._0_7_ = auVar43._8_7_;
  auVar73._1_8_ = SUB158(auVar64 << 0x40,7);
  auVar73[0] = auVar123[3];
  auVar73._9_6_ = 0;
  auVar74._1_10_ = SUB1510(auVar73 << 0x30,5);
  auVar74[0] = auVar123[2];
  auVar74._11_4_ = 0;
  auVar49[2] = auVar123[1];
  auVar49._0_2_ = auVar123._0_2_;
  auVar49._3_12_ = SUB1512(auVar74 << 0x20,3);
  auVar53._2_13_ = auVar49._2_13_;
  auVar53._0_2_ = auVar123._0_2_ & 0xff;
  auVar129 = *(undefined1 (*) [16])thresh1;
  auVar122._0_8_ = auVar58._0_8_;
  auVar122._8_8_ = auVar53._0_8_;
  auVar123 = psllw(auVar122,auVar128);
  sVar121 = auVar143._0_2_;
  sVar89 = auVar98._0_2_;
  auVar99._0_2_ = (ushort)(sVar89 < sVar121) * sVar121 | (ushort)(sVar89 >= sVar121) * sVar89;
  sVar121 = auVar143._2_2_;
  sVar89 = auVar98._2_2_;
  auVar99._2_2_ = (ushort)(sVar89 < sVar121) * sVar121 | (ushort)(sVar89 >= sVar121) * sVar89;
  sVar121 = auVar143._4_2_;
  sVar89 = auVar98._4_2_;
  auVar99._4_2_ = (ushort)(sVar89 < sVar121) * sVar121 | (ushort)(sVar89 >= sVar121) * sVar89;
  sVar121 = auVar143._6_2_;
  sVar89 = auVar98._6_2_;
  auVar99._6_2_ = (ushort)(sVar89 < sVar121) * sVar121 | (ushort)(sVar89 >= sVar121) * sVar89;
  sVar121 = auVar143._8_2_;
  sVar89 = auVar98._8_2_;
  auVar99._8_2_ = (ushort)(sVar89 < sVar121) * sVar121 | (ushort)(sVar89 >= sVar121) * sVar89;
  sVar121 = auVar143._10_2_;
  sVar89 = auVar98._10_2_;
  auVar99._10_2_ = (ushort)(sVar89 < sVar121) * sVar121 | (ushort)(sVar89 >= sVar121) * sVar89;
  sVar121 = auVar143._12_2_;
  sVar89 = auVar98._12_2_;
  sVar103 = auVar98._14_2_;
  auVar99._12_2_ = (ushort)(sVar89 < sVar121) * sVar121 | (ushort)(sVar89 >= sVar121) * sVar89;
  sVar121 = auVar143._14_2_;
  auVar99._14_2_ = (ushort)(sVar103 < sVar121) * sVar121 | (ushort)(sVar103 >= sVar121) * sVar103;
  auVar14[0xd] = 0;
  auVar14._0_13_ = auVar113._0_13_;
  auVar14[0xe] = auVar113[7];
  auVar20[0xc] = auVar113[6];
  auVar20._0_12_ = auVar113._0_12_;
  auVar20._13_2_ = auVar14._13_2_;
  auVar26[0xb] = 0;
  auVar26._0_11_ = auVar113._0_11_;
  auVar26._12_3_ = auVar20._12_3_;
  auVar32[10] = auVar113[5];
  auVar32._0_10_ = auVar113._0_10_;
  auVar32._11_4_ = auVar26._11_4_;
  auVar38[9] = 0;
  auVar38._0_9_ = auVar113._0_9_;
  auVar38._10_5_ = auVar32._10_5_;
  auVar44[8] = auVar113[4];
  auVar44._0_8_ = auVar113._0_8_;
  auVar44._9_6_ = auVar38._9_6_;
  auVar65._7_8_ = 0;
  auVar65._0_7_ = auVar44._8_7_;
  auVar75._1_8_ = SUB158(auVar65 << 0x40,7);
  auVar75[0] = auVar113[3];
  auVar75._9_6_ = 0;
  auVar76._1_10_ = SUB1510(auVar75 << 0x30,5);
  auVar76[0] = auVar113[2];
  auVar76._11_4_ = 0;
  auVar54._3_12_ = SUB1512(auVar76 << 0x20,3);
  auVar54[2] = auVar113[1];
  auVar54[1] = 0;
  auVar54[0] = auVar113[0];
  auVar15[0xd] = 0;
  auVar15._0_13_ = auVar118._0_13_;
  auVar15[0xe] = auVar118[7];
  auVar21[0xc] = auVar118[6];
  auVar21._0_12_ = auVar118._0_12_;
  auVar21._13_2_ = auVar15._13_2_;
  auVar27[0xb] = 0;
  auVar27._0_11_ = auVar118._0_11_;
  auVar27._12_3_ = auVar21._12_3_;
  auVar33[10] = auVar118[5];
  auVar33._0_10_ = auVar118._0_10_;
  auVar33._11_4_ = auVar27._11_4_;
  auVar39[9] = 0;
  auVar39._0_9_ = auVar118._0_9_;
  auVar39._10_5_ = auVar33._10_5_;
  auVar45[8] = auVar118[4];
  auVar45._0_8_ = auVar118._0_8_;
  auVar45._9_6_ = auVar39._9_6_;
  auVar66._7_8_ = 0;
  auVar66._0_7_ = auVar45._8_7_;
  auVar77._1_8_ = SUB158(auVar66 << 0x40,7);
  auVar77[0] = auVar118[3];
  auVar77._9_6_ = 0;
  auVar78._1_10_ = SUB1510(auVar77 << 0x30,5);
  auVar78[0] = auVar118[2];
  auVar78._11_4_ = 0;
  auVar50[2] = auVar118[1];
  auVar50._0_2_ = auVar118._0_2_;
  auVar50._3_12_ = SUB1512(auVar78 << 0x20,3);
  auVar55._2_13_ = auVar50._2_13_;
  auVar55._0_2_ = auVar118._0_2_ & 0xff;
  auVar117._0_8_ = auVar54._0_8_;
  auVar117._8_8_ = auVar55._0_8_;
  auVar118 = psllw(auVar117,auVar128);
  auVar16[0xd] = 0;
  auVar16._0_13_ = auVar107._0_13_;
  auVar16[0xe] = auVar107[7];
  auVar22[0xc] = auVar107[6];
  auVar22._0_12_ = auVar107._0_12_;
  auVar22._13_2_ = auVar16._13_2_;
  auVar28[0xb] = 0;
  auVar28._0_11_ = auVar107._0_11_;
  auVar28._12_3_ = auVar22._12_3_;
  auVar34[10] = auVar107[5];
  auVar34._0_10_ = auVar107._0_10_;
  auVar34._11_4_ = auVar28._11_4_;
  auVar40[9] = 0;
  auVar40._0_9_ = auVar107._0_9_;
  auVar40._10_5_ = auVar34._10_5_;
  auVar46[8] = auVar107[4];
  auVar46._0_8_ = auVar107._0_8_;
  auVar46._9_6_ = auVar40._9_6_;
  auVar67._7_8_ = 0;
  auVar67._0_7_ = auVar46._8_7_;
  auVar79._1_8_ = SUB158(auVar67 << 0x40,7);
  auVar79[0] = auVar107[3];
  auVar79._9_6_ = 0;
  auVar80._1_10_ = SUB1510(auVar79 << 0x30,5);
  auVar80[0] = auVar107[2];
  auVar80._11_4_ = 0;
  auVar51[2] = auVar107[1];
  auVar51._0_2_ = auVar107._0_2_;
  auVar51._3_12_ = SUB1512(auVar80 << 0x20,3);
  auVar56._2_13_ = auVar51._2_13_;
  auVar56._0_2_ = auVar107._0_2_ & 0xff;
  auVar17[0xd] = 0;
  auVar17._0_13_ = auVar129._0_13_;
  auVar17[0xe] = auVar129[7];
  auVar23[0xc] = auVar129[6];
  auVar23._0_12_ = auVar129._0_12_;
  auVar23._13_2_ = auVar17._13_2_;
  auVar29[0xb] = 0;
  auVar29._0_11_ = auVar129._0_11_;
  auVar29._12_3_ = auVar23._12_3_;
  auVar35[10] = auVar129[5];
  auVar35._0_10_ = auVar129._0_10_;
  auVar35._11_4_ = auVar29._11_4_;
  auVar41[9] = 0;
  auVar41._0_9_ = auVar129._0_9_;
  auVar41._10_5_ = auVar35._10_5_;
  auVar47[8] = auVar129[4];
  auVar47._0_8_ = auVar129._0_8_;
  auVar47._9_6_ = auVar41._9_6_;
  auVar68._7_8_ = 0;
  auVar68._0_7_ = auVar47._8_7_;
  auVar81._1_8_ = SUB158(auVar68 << 0x40,7);
  auVar81[0] = auVar129[3];
  auVar81._9_6_ = 0;
  auVar82._1_10_ = SUB1510(auVar81 << 0x30,5);
  auVar82[0] = auVar129[2];
  auVar82._11_4_ = 0;
  auVar52[2] = auVar129[1];
  auVar52._0_2_ = auVar129._0_2_;
  auVar52._3_12_ = SUB1512(auVar82 << 0x20,3);
  auVar57._2_13_ = auVar52._2_13_;
  auVar57._0_2_ = auVar129._0_2_ & 0xff;
  auVar131._0_8_ = auVar56._0_8_;
  auVar131._8_8_ = auVar57._0_8_;
  auVar98 = psllw(auVar131,auVar128);
  auVar129 = pshuflw(auVar128,ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f))),0);
  auVar130._0_4_ = auVar129._0_4_;
  auVar130._4_4_ = auVar130._0_4_;
  auVar130._8_4_ = auVar130._0_4_;
  auVar130._12_4_ = auVar130._0_4_;
  auVar129 = paddusw(auVar141 | auVar97,auVar141 | auVar97);
  auVar138._0_2_ = auVar137._0_2_ >> 1;
  auVar138._2_2_ = auVar137._2_2_ >> 1;
  auVar138._4_2_ = auVar137._4_2_ >> 1;
  auVar138._6_2_ = auVar137._6_2_ >> 1;
  auVar138._8_2_ = auVar137._8_2_ >> 1;
  auVar138._10_2_ = auVar137._10_2_ >> 1;
  auVar138._12_2_ = auVar137._12_2_ >> 1;
  auVar138._14_2_ = auVar137._14_2_ >> 1;
  auVar129 = paddusw(auVar138,auVar129);
  auVar129 = auVar129 ^ _DAT_004dd160;
  auVar123 = auVar123 ^ _DAT_004dd160;
  auVar139._0_2_ = -(ushort)(auVar123._0_2_ < auVar129._0_2_);
  auVar139._2_2_ = -(ushort)(auVar123._2_2_ < auVar129._2_2_);
  auVar139._4_2_ = -(ushort)(auVar123._4_2_ < auVar129._4_2_);
  auVar139._6_2_ = -(ushort)(auVar123._6_2_ < auVar129._6_2_);
  auVar139._8_2_ = -(ushort)(auVar123._8_2_ < auVar129._8_2_);
  auVar139._10_2_ = -(ushort)(auVar123._10_2_ < auVar129._10_2_);
  auVar139._12_2_ = -(ushort)(auVar123._12_2_ < auVar129._12_2_);
  auVar139._14_2_ = -(ushort)(auVar123._14_2_ < auVar129._14_2_);
  auVar129 = paddusw(auVar118,_DAT_00517ae0);
  auVar129 = auVar129 & auVar139;
  sVar121 = auVar129._0_2_;
  auVar124._0_2_ =
       (sVar121 < (short)auVar99._0_2_) * auVar99._0_2_ |
       (ushort)(sVar121 >= (short)auVar99._0_2_) * sVar121;
  sVar121 = auVar129._2_2_;
  auVar124._2_2_ =
       (sVar121 < (short)auVar99._2_2_) * auVar99._2_2_ |
       (ushort)(sVar121 >= (short)auVar99._2_2_) * sVar121;
  sVar121 = auVar129._4_2_;
  auVar124._4_2_ =
       (sVar121 < (short)auVar99._4_2_) * auVar99._4_2_ |
       (ushort)(sVar121 >= (short)auVar99._4_2_) * sVar121;
  sVar121 = auVar129._6_2_;
  auVar124._6_2_ =
       (sVar121 < (short)auVar99._6_2_) * auVar99._6_2_ |
       (ushort)(sVar121 >= (short)auVar99._6_2_) * sVar121;
  sVar121 = auVar129._8_2_;
  auVar124._8_2_ =
       (sVar121 < (short)auVar99._8_2_) * auVar99._8_2_ |
       (ushort)(sVar121 >= (short)auVar99._8_2_) * sVar121;
  sVar121 = auVar129._10_2_;
  auVar124._10_2_ =
       (sVar121 < (short)auVar99._10_2_) * auVar99._10_2_ |
       (ushort)(sVar121 >= (short)auVar99._10_2_) * sVar121;
  sVar121 = auVar129._12_2_;
  sVar89 = auVar129._14_2_;
  auVar124._12_2_ =
       (sVar121 < (short)auVar99._12_2_) * auVar99._12_2_ |
       (ushort)(sVar121 >= (short)auVar99._12_2_) * sVar121;
  auVar124._14_2_ =
       (sVar89 < (short)auVar99._14_2_) * auVar99._14_2_ |
       (ushort)(sVar89 >= (short)auVar99._14_2_) * sVar89;
  auVar113 = psubsw(auVar112,auVar130);
  auVar107 = psubsw(auVar106,auVar130);
  auVar123 = psubsw(auVar88,auVar130);
  auVar129 = psubsw(auVar84,auVar130);
  auVar97 = psllw(_DAT_00517ae0,ZEXT416((uint)bd));
  auVar140._8_4_ = 0xffffffff;
  auVar140._0_8_ = 0xffffffffffffffff;
  auVar140._12_4_ = 0xffffffff;
  auVar97 = paddsw(auVar97,auVar140);
  auVar97 = psubsw(auVar97,auVar130);
  auVar135 = psubsw((undefined1  [16])0x0,auVar130);
  auVar137 = psubsw(auVar107,auVar129);
  sVar102 = auVar97._0_2_;
  sVar121 = auVar137._0_2_;
  uVar142 = (ushort)(sVar102 < sVar121) * sVar102 | (ushort)(sVar102 >= sVar121) * sVar121;
  sVar104 = auVar97._2_2_;
  sVar121 = auVar137._2_2_;
  uVar146 = (ushort)(sVar104 < sVar121) * sVar104 | (ushort)(sVar104 >= sVar121) * sVar121;
  sVar7 = auVar97._4_2_;
  sVar121 = auVar137._4_2_;
  uVar147 = (ushort)(sVar7 < sVar121) * sVar7 | (ushort)(sVar7 >= sVar121) * sVar121;
  sVar8 = auVar97._6_2_;
  sVar121 = auVar137._6_2_;
  uVar148 = (ushort)(sVar8 < sVar121) * sVar8 | (ushort)(sVar8 >= sVar121) * sVar121;
  sVar9 = auVar97._8_2_;
  sVar121 = auVar137._8_2_;
  uVar149 = (ushort)(sVar9 < sVar121) * sVar9 | (ushort)(sVar9 >= sVar121) * sVar121;
  sVar10 = auVar97._10_2_;
  sVar121 = auVar137._10_2_;
  uVar150 = (ushort)(sVar10 < sVar121) * sVar10 | (ushort)(sVar10 >= sVar121) * sVar121;
  sVar11 = auVar97._12_2_;
  sVar121 = auVar137._12_2_;
  sVar89 = auVar137._14_2_;
  uVar151 = (ushort)(sVar11 < sVar121) * sVar11 | (ushort)(sVar11 >= sVar121) * sVar121;
  sVar12 = auVar97._14_2_;
  uVar152 = (ushort)(sVar12 < sVar89) * sVar12 | (ushort)(sVar12 >= sVar89) * sVar89;
  sVar121 = auVar135._0_2_;
  auVar144._0_2_ =
       (ushort)((short)uVar142 < sVar121) * sVar121 | ((short)uVar142 >= sVar121) * uVar142;
  sVar89 = auVar135._2_2_;
  auVar144._2_2_ = (ushort)((short)uVar146 < sVar89) * sVar89 | ((short)uVar146 >= sVar89) * uVar146
  ;
  sVar103 = auVar135._4_2_;
  auVar144._4_2_ =
       (ushort)((short)uVar147 < sVar103) * sVar103 | ((short)uVar147 >= sVar103) * uVar147;
  sVar2 = auVar135._6_2_;
  auVar144._6_2_ = (ushort)((short)uVar148 < sVar2) * sVar2 | ((short)uVar148 >= sVar2) * uVar148;
  sVar3 = auVar135._8_2_;
  auVar144._8_2_ = (ushort)((short)uVar149 < sVar3) * sVar3 | ((short)uVar149 >= sVar3) * uVar149;
  sVar4 = auVar135._10_2_;
  auVar144._10_2_ = (ushort)((short)uVar150 < sVar4) * sVar4 | ((short)uVar150 >= sVar4) * uVar150;
  sVar5 = auVar135._12_2_;
  auVar144._12_2_ = (ushort)((short)uVar151 < sVar5) * sVar5 | ((short)uVar151 >= sVar5) * uVar151;
  sVar6 = auVar135._14_2_;
  auVar144._14_2_ = (ushort)((short)uVar152 < sVar6) * sVar6 | ((short)uVar152 >= sVar6) * uVar152;
  auVar99 = auVar99 ^ _DAT_004dd160;
  auVar98 = auVar98 ^ _DAT_004dd160;
  auVar128._0_2_ = -(ushort)(auVar98._0_2_ < auVar99._0_2_);
  auVar128._2_2_ = -(ushort)(auVar98._2_2_ < auVar99._2_2_);
  auVar128._4_2_ = -(ushort)(auVar98._4_2_ < auVar99._4_2_);
  auVar128._6_2_ = -(ushort)(auVar98._6_2_ < auVar99._6_2_);
  auVar128._8_2_ = -(ushort)(auVar98._8_2_ < auVar99._8_2_);
  auVar128._10_2_ = -(ushort)(auVar98._10_2_ < auVar99._10_2_);
  auVar128._12_2_ = -(ushort)(auVar98._12_2_ < auVar99._12_2_);
  auVar128._14_2_ = -(ushort)(auVar98._14_2_ < auVar99._14_2_);
  auVar97 = psubsw(auVar123,auVar113);
  auVar98 = paddsw(auVar144 & auVar128,auVar97);
  auVar98 = paddsw(auVar98,auVar97);
  auVar97 = paddsw(auVar98,auVar97);
  sVar83 = auVar97._0_2_;
  uVar142 = (ushort)(sVar102 < sVar83) * sVar102 | (ushort)(sVar102 >= sVar83) * sVar83;
  sVar83 = auVar97._2_2_;
  uVar146 = (ushort)(sVar104 < sVar83) * sVar104 | (ushort)(sVar104 >= sVar83) * sVar83;
  sVar83 = auVar97._4_2_;
  uVar147 = (ushort)(sVar7 < sVar83) * sVar7 | (ushort)(sVar7 >= sVar83) * sVar83;
  sVar83 = auVar97._6_2_;
  uVar148 = (ushort)(sVar8 < sVar83) * sVar8 | (ushort)(sVar8 >= sVar83) * sVar83;
  sVar83 = auVar97._8_2_;
  uVar149 = (ushort)(sVar9 < sVar83) * sVar9 | (ushort)(sVar9 >= sVar83) * sVar83;
  sVar83 = auVar97._10_2_;
  uVar150 = (ushort)(sVar10 < sVar83) * sVar10 | (ushort)(sVar10 >= sVar83) * sVar83;
  sVar83 = auVar97._12_2_;
  sVar85 = auVar97._14_2_;
  uVar151 = (ushort)(sVar11 < sVar83) * sVar11 | (ushort)(sVar11 >= sVar83) * sVar83;
  uVar152 = (ushort)(sVar12 < sVar85) * sVar12 | (ushort)(sVar12 >= sVar85) * sVar85;
  auVar145._0_2_ =
       (ushort)((short)uVar142 < sVar121) * sVar121 | ((short)uVar142 >= sVar121) * uVar142;
  auVar145._2_2_ = (ushort)((short)uVar146 < sVar89) * sVar89 | ((short)uVar146 >= sVar89) * uVar146
  ;
  auVar145._4_2_ =
       (ushort)((short)uVar147 < sVar103) * sVar103 | ((short)uVar147 >= sVar103) * uVar147;
  auVar145._6_2_ = (ushort)((short)uVar148 < sVar2) * sVar2 | ((short)uVar148 >= sVar2) * uVar148;
  auVar145._8_2_ = (ushort)((short)uVar149 < sVar3) * sVar3 | ((short)uVar149 >= sVar3) * uVar149;
  auVar145._10_2_ = (ushort)((short)uVar150 < sVar4) * sVar4 | ((short)uVar150 >= sVar4) * uVar150;
  auVar145._12_2_ = (ushort)((short)uVar151 < sVar5) * sVar5 | ((short)uVar151 >= sVar5) * uVar151;
  auVar145._14_2_ = (ushort)((short)uVar152 < sVar6) * sVar6 | ((short)uVar152 >= sVar6) * uVar152;
  auVar118 = psubusw(auVar124,auVar118);
  auVar125._0_2_ = -(ushort)(auVar118._0_2_ == 0);
  auVar125._2_2_ = -(ushort)(auVar118._2_2_ == 0);
  auVar125._4_2_ = -(ushort)(auVar118._4_2_ == 0);
  auVar125._6_2_ = -(ushort)(auVar118._6_2_ == 0);
  auVar125._8_2_ = -(ushort)(auVar118._8_2_ == 0);
  auVar125._10_2_ = -(ushort)(auVar118._10_2_ == 0);
  auVar125._12_2_ = -(ushort)(auVar118._12_2_ == 0);
  auVar125._14_2_ = -(ushort)(auVar118._14_2_ == 0);
  auVar118 = paddsw(_DAT_0050bea0,auVar125 & auVar145);
  auVar97 = paddsw(auVar125 & auVar145,_DAT_00517b00);
  sVar83 = auVar118._0_2_;
  uVar142 = (ushort)(sVar102 < sVar83) * sVar102 | (ushort)(sVar102 >= sVar83) * sVar83;
  sVar83 = auVar118._2_2_;
  uVar146 = (ushort)(sVar104 < sVar83) * sVar104 | (ushort)(sVar104 >= sVar83) * sVar83;
  sVar83 = auVar118._4_2_;
  uVar147 = (ushort)(sVar7 < sVar83) * sVar7 | (ushort)(sVar7 >= sVar83) * sVar83;
  sVar83 = auVar118._6_2_;
  uVar148 = (ushort)(sVar8 < sVar83) * sVar8 | (ushort)(sVar8 >= sVar83) * sVar83;
  sVar83 = auVar118._8_2_;
  uVar149 = (ushort)(sVar9 < sVar83) * sVar9 | (ushort)(sVar9 >= sVar83) * sVar83;
  sVar83 = auVar118._10_2_;
  uVar150 = (ushort)(sVar10 < sVar83) * sVar10 | (ushort)(sVar10 >= sVar83) * sVar83;
  sVar83 = auVar118._12_2_;
  sVar85 = auVar118._14_2_;
  uVar151 = (ushort)(sVar11 < sVar83) * sVar11 | (ushort)(sVar11 >= sVar83) * sVar83;
  uVar152 = (ushort)(sVar12 < sVar85) * sVar12 | (ushort)(sVar12 >= sVar85) * sVar85;
  auVar119._0_2_ =
       (ushort)((short)uVar142 < sVar121) * sVar121 | ((short)uVar142 >= sVar121) * uVar142;
  auVar119._2_2_ = (ushort)((short)uVar146 < sVar89) * sVar89 | ((short)uVar146 >= sVar89) * uVar146
  ;
  auVar119._4_2_ =
       (ushort)((short)uVar147 < sVar103) * sVar103 | ((short)uVar147 >= sVar103) * uVar147;
  auVar119._6_2_ = (ushort)((short)uVar148 < sVar2) * sVar2 | ((short)uVar148 >= sVar2) * uVar148;
  auVar119._8_2_ = (ushort)((short)uVar149 < sVar3) * sVar3 | ((short)uVar149 >= sVar3) * uVar149;
  auVar119._10_2_ = (ushort)((short)uVar150 < sVar4) * sVar4 | ((short)uVar150 >= sVar4) * uVar150;
  auVar119._12_2_ = (ushort)((short)uVar151 < sVar5) * sVar5 | ((short)uVar151 >= sVar5) * uVar151;
  auVar119._14_2_ = (ushort)((short)uVar152 < sVar6) * sVar6 | ((short)uVar152 >= sVar6) * uVar152;
  sVar83 = auVar97._0_2_;
  uVar142 = (ushort)(sVar102 < sVar83) * sVar102 | (ushort)(sVar102 >= sVar83) * sVar83;
  sVar83 = auVar97._2_2_;
  uVar146 = (ushort)(sVar104 < sVar83) * sVar104 | (ushort)(sVar104 >= sVar83) * sVar83;
  sVar83 = auVar97._4_2_;
  uVar147 = (ushort)(sVar7 < sVar83) * sVar7 | (ushort)(sVar7 >= sVar83) * sVar83;
  sVar83 = auVar97._6_2_;
  uVar148 = (ushort)(sVar8 < sVar83) * sVar8 | (ushort)(sVar8 >= sVar83) * sVar83;
  sVar83 = auVar97._8_2_;
  uVar149 = (ushort)(sVar9 < sVar83) * sVar9 | (ushort)(sVar9 >= sVar83) * sVar83;
  sVar83 = auVar97._10_2_;
  uVar150 = (ushort)(sVar10 < sVar83) * sVar10 | (ushort)(sVar10 >= sVar83) * sVar83;
  sVar83 = auVar97._12_2_;
  sVar85 = auVar97._14_2_;
  uVar151 = (ushort)(sVar11 < sVar83) * sVar11 | (ushort)(sVar11 >= sVar83) * sVar83;
  uVar152 = (ushort)(sVar12 < sVar85) * sVar12 | (ushort)(sVar12 >= sVar85) * sVar85;
  auVar126._0_2_ =
       (ushort)((short)uVar142 < sVar121) * sVar121 | ((short)uVar142 >= sVar121) * uVar142;
  auVar126._2_2_ = (ushort)((short)uVar146 < sVar89) * sVar89 | ((short)uVar146 >= sVar89) * uVar146
  ;
  auVar126._4_2_ =
       (ushort)((short)uVar147 < sVar103) * sVar103 | ((short)uVar147 >= sVar103) * uVar147;
  auVar126._6_2_ = (ushort)((short)uVar148 < sVar2) * sVar2 | ((short)uVar148 >= sVar2) * uVar148;
  auVar126._8_2_ = (ushort)((short)uVar149 < sVar3) * sVar3 | ((short)uVar149 >= sVar3) * uVar149;
  auVar126._10_2_ = (ushort)((short)uVar150 < sVar4) * sVar4 | ((short)uVar150 >= sVar4) * uVar150;
  auVar126._12_2_ = (ushort)((short)uVar151 < sVar5) * sVar5 | ((short)uVar151 >= sVar5) * uVar151;
  auVar126._14_2_ = (ushort)((short)uVar152 < sVar6) * sVar6 | ((short)uVar152 >= sVar6) * uVar152;
  auVar97 = psraw(auVar119,3);
  auVar98 = psraw(auVar126,3);
  auVar123 = psubsw(auVar123,auVar97);
  sVar83 = auVar123._0_2_;
  uVar142 = (ushort)(sVar102 < sVar83) * sVar102 | (ushort)(sVar102 >= sVar83) * sVar83;
  sVar83 = auVar123._2_2_;
  uVar146 = (ushort)(sVar104 < sVar83) * sVar104 | (ushort)(sVar104 >= sVar83) * sVar83;
  sVar83 = auVar123._4_2_;
  uVar147 = (ushort)(sVar7 < sVar83) * sVar7 | (ushort)(sVar7 >= sVar83) * sVar83;
  sVar83 = auVar123._6_2_;
  uVar148 = (ushort)(sVar8 < sVar83) * sVar8 | (ushort)(sVar8 >= sVar83) * sVar83;
  sVar83 = auVar123._8_2_;
  uVar149 = (ushort)(sVar9 < sVar83) * sVar9 | (ushort)(sVar9 >= sVar83) * sVar83;
  sVar83 = auVar123._10_2_;
  uVar150 = (ushort)(sVar10 < sVar83) * sVar10 | (ushort)(sVar10 >= sVar83) * sVar83;
  sVar83 = auVar123._12_2_;
  sVar85 = auVar123._14_2_;
  uVar151 = (ushort)(sVar11 < sVar83) * sVar11 | (ushort)(sVar11 >= sVar83) * sVar83;
  uVar152 = (ushort)(sVar12 < sVar85) * sVar12 | (ushort)(sVar12 >= sVar85) * sVar85;
  auVar118._0_2_ =
       (ushort)((short)uVar142 < sVar121) * sVar121 | ((short)uVar142 >= sVar121) * uVar142;
  auVar118._2_2_ = (ushort)((short)uVar146 < sVar89) * sVar89 | ((short)uVar146 >= sVar89) * uVar146
  ;
  auVar118._4_2_ =
       (ushort)((short)uVar147 < sVar103) * sVar103 | ((short)uVar147 >= sVar103) * uVar147;
  auVar118._6_2_ = (ushort)((short)uVar148 < sVar2) * sVar2 | ((short)uVar148 >= sVar2) * uVar148;
  auVar118._8_2_ = (ushort)((short)uVar149 < sVar3) * sVar3 | ((short)uVar149 >= sVar3) * uVar149;
  auVar118._10_2_ = (ushort)((short)uVar150 < sVar4) * sVar4 | ((short)uVar150 >= sVar4) * uVar150;
  auVar118._12_2_ = (ushort)((short)uVar151 < sVar5) * sVar5 | ((short)uVar151 >= sVar5) * uVar151;
  auVar118._14_2_ = (ushort)((short)uVar152 < sVar6) * sVar6 | ((short)uVar152 >= sVar6) * uVar152;
  auVar123 = paddsw(auVar98,auVar113);
  sVar83 = auVar123._0_2_;
  uVar142 = (ushort)(sVar102 < sVar83) * sVar102 | (ushort)(sVar102 >= sVar83) * sVar83;
  sVar83 = auVar123._2_2_;
  uVar146 = (ushort)(sVar104 < sVar83) * sVar104 | (ushort)(sVar104 >= sVar83) * sVar83;
  sVar83 = auVar123._4_2_;
  uVar147 = (ushort)(sVar7 < sVar83) * sVar7 | (ushort)(sVar7 >= sVar83) * sVar83;
  sVar83 = auVar123._6_2_;
  uVar148 = (ushort)(sVar8 < sVar83) * sVar8 | (ushort)(sVar8 >= sVar83) * sVar83;
  sVar83 = auVar123._8_2_;
  uVar149 = (ushort)(sVar9 < sVar83) * sVar9 | (ushort)(sVar9 >= sVar83) * sVar83;
  sVar83 = auVar123._10_2_;
  uVar150 = (ushort)(sVar10 < sVar83) * sVar10 | (ushort)(sVar10 >= sVar83) * sVar83;
  sVar83 = auVar123._12_2_;
  sVar85 = auVar123._14_2_;
  uVar151 = (ushort)(sVar11 < sVar83) * sVar11 | (ushort)(sVar11 >= sVar83) * sVar83;
  uVar152 = (ushort)(sVar12 < sVar85) * sVar12 | (ushort)(sVar12 >= sVar85) * sVar85;
  auVar127._0_2_ =
       (ushort)((short)uVar142 < sVar121) * sVar121 | ((short)uVar142 >= sVar121) * uVar142;
  auVar127._2_2_ = (ushort)((short)uVar146 < sVar89) * sVar89 | ((short)uVar146 >= sVar89) * uVar146
  ;
  auVar127._4_2_ =
       (ushort)((short)uVar147 < sVar103) * sVar103 | ((short)uVar147 >= sVar103) * uVar147;
  auVar127._6_2_ = (ushort)((short)uVar148 < sVar2) * sVar2 | ((short)uVar148 >= sVar2) * uVar148;
  auVar127._8_2_ = (ushort)((short)uVar149 < sVar3) * sVar3 | ((short)uVar149 >= sVar3) * uVar149;
  auVar127._10_2_ = (ushort)((short)uVar150 < sVar4) * sVar4 | ((short)uVar150 >= sVar4) * uVar150;
  auVar127._12_2_ = (ushort)((short)uVar151 < sVar5) * sVar5 | ((short)uVar151 >= sVar5) * uVar151;
  auVar127._14_2_ = (ushort)((short)uVar152 < sVar6) * sVar6 | ((short)uVar152 >= sVar6) * uVar152;
  auVar113 = paddsw(auVar118,auVar130);
  auVar98 = paddsw(auVar127,auVar130);
  auVar120._0_2_ = auVar97._0_2_ + 1;
  auVar120._2_2_ = auVar97._2_2_ + 1;
  auVar120._4_2_ = auVar97._4_2_ + 1;
  auVar120._6_2_ = auVar97._6_2_ + 1;
  auVar120._8_2_ = auVar97._8_2_ + 1;
  auVar120._10_2_ = auVar97._10_2_ + 1;
  auVar120._12_2_ = auVar97._12_2_ + 1;
  auVar120._14_2_ = auVar97._14_2_ + 1;
  auVar118 = psraw(auVar120,1);
  auVar129 = psubsw(auVar129,~auVar128 & auVar118);
  sVar83 = auVar129._0_2_;
  uVar142 = (ushort)(sVar102 < sVar83) * sVar102 | (ushort)(sVar102 >= sVar83) * sVar83;
  sVar83 = auVar129._2_2_;
  uVar146 = (ushort)(sVar104 < sVar83) * sVar104 | (ushort)(sVar104 >= sVar83) * sVar83;
  sVar83 = auVar129._4_2_;
  uVar147 = (ushort)(sVar7 < sVar83) * sVar7 | (ushort)(sVar7 >= sVar83) * sVar83;
  sVar83 = auVar129._6_2_;
  uVar148 = (ushort)(sVar8 < sVar83) * sVar8 | (ushort)(sVar8 >= sVar83) * sVar83;
  sVar83 = auVar129._8_2_;
  uVar149 = (ushort)(sVar9 < sVar83) * sVar9 | (ushort)(sVar9 >= sVar83) * sVar83;
  sVar83 = auVar129._10_2_;
  uVar150 = (ushort)(sVar10 < sVar83) * sVar10 | (ushort)(sVar10 >= sVar83) * sVar83;
  sVar83 = auVar129._12_2_;
  sVar85 = auVar129._14_2_;
  uVar151 = (ushort)(sVar11 < sVar83) * sVar11 | (ushort)(sVar11 >= sVar83) * sVar83;
  uVar152 = (ushort)(sVar12 < sVar85) * sVar12 | (ushort)(sVar12 >= sVar85) * sVar85;
  auVar123._0_2_ =
       (ushort)((short)uVar142 < sVar121) * sVar121 | ((short)uVar142 >= sVar121) * uVar142;
  auVar123._2_2_ = (ushort)((short)uVar146 < sVar89) * sVar89 | ((short)uVar146 >= sVar89) * uVar146
  ;
  auVar123._4_2_ =
       (ushort)((short)uVar147 < sVar103) * sVar103 | ((short)uVar147 >= sVar103) * uVar147;
  auVar123._6_2_ = (ushort)((short)uVar148 < sVar2) * sVar2 | ((short)uVar148 >= sVar2) * uVar148;
  auVar123._8_2_ = (ushort)((short)uVar149 < sVar3) * sVar3 | ((short)uVar149 >= sVar3) * uVar149;
  auVar123._10_2_ = (ushort)((short)uVar150 < sVar4) * sVar4 | ((short)uVar150 >= sVar4) * uVar150;
  auVar123._12_2_ = (ushort)((short)uVar151 < sVar5) * sVar5 | ((short)uVar151 >= sVar5) * uVar151;
  auVar123._14_2_ = (ushort)((short)uVar152 < sVar6) * sVar6 | ((short)uVar152 >= sVar6) * uVar152;
  auVar129 = paddsw(~auVar128 & auVar118,auVar107);
  sVar83 = auVar129._0_2_;
  uVar142 = (ushort)(sVar102 < sVar83) * sVar102 | (ushort)(sVar102 >= sVar83) * sVar83;
  sVar102 = auVar129._2_2_;
  uVar146 = (ushort)(sVar104 < sVar102) * sVar104 | (ushort)(sVar104 >= sVar102) * sVar102;
  sVar102 = auVar129._4_2_;
  uVar147 = (ushort)(sVar7 < sVar102) * sVar7 | (ushort)(sVar7 >= sVar102) * sVar102;
  sVar102 = auVar129._6_2_;
  uVar148 = (ushort)(sVar8 < sVar102) * sVar8 | (ushort)(sVar8 >= sVar102) * sVar102;
  sVar102 = auVar129._8_2_;
  uVar149 = (ushort)(sVar9 < sVar102) * sVar9 | (ushort)(sVar9 >= sVar102) * sVar102;
  sVar102 = auVar129._10_2_;
  uVar150 = (ushort)(sVar10 < sVar102) * sVar10 | (ushort)(sVar10 >= sVar102) * sVar102;
  sVar102 = auVar129._12_2_;
  sVar104 = auVar129._14_2_;
  uVar151 = (ushort)(sVar11 < sVar102) * sVar11 | (ushort)(sVar11 >= sVar102) * sVar102;
  uVar152 = (ushort)(sVar12 < sVar104) * sVar12 | (ushort)(sVar12 >= sVar104) * sVar104;
  auVar100._0_2_ =
       (ushort)((short)uVar142 < sVar121) * sVar121 | ((short)uVar142 >= sVar121) * uVar142;
  auVar100._2_2_ = (ushort)((short)uVar146 < sVar89) * sVar89 | ((short)uVar146 >= sVar89) * uVar146
  ;
  auVar100._4_2_ =
       (ushort)((short)uVar147 < sVar103) * sVar103 | ((short)uVar147 >= sVar103) * uVar147;
  auVar100._6_2_ = (ushort)((short)uVar148 < sVar2) * sVar2 | ((short)uVar148 >= sVar2) * uVar148;
  auVar100._8_2_ = (ushort)((short)uVar149 < sVar3) * sVar3 | ((short)uVar149 >= sVar3) * uVar149;
  auVar100._10_2_ = (ushort)((short)uVar150 < sVar4) * sVar4 | ((short)uVar150 >= sVar4) * uVar150;
  auVar100._12_2_ = (ushort)((short)uVar151 < sVar5) * sVar5 | ((short)uVar151 >= sVar5) * uVar151;
  auVar100._14_2_ = (ushort)((short)uVar152 < sVar6) * sVar6 | ((short)uVar152 >= sVar6) * uVar152;
  auVar129 = paddsw(auVar123,auVar130);
  auVar123 = paddsw(auVar100,auVar130);
  auVar110._0_12_ = auVar123._0_12_;
  auVar110._12_2_ = auVar123._6_2_;
  auVar110._14_2_ = auVar98._6_2_;
  auVar109._12_4_ = auVar110._12_4_;
  auVar109._0_10_ = auVar123._0_10_;
  auVar109._10_2_ = auVar98._4_2_;
  auVar108._10_6_ = auVar109._10_6_;
  auVar108._0_8_ = auVar123._0_8_;
  auVar108._8_2_ = auVar123._4_2_;
  auVar69._4_8_ = auVar108._8_8_;
  auVar69._2_2_ = auVar98._2_2_;
  auVar69._0_2_ = auVar123._2_2_;
  auVar116._0_12_ = auVar113._0_12_;
  auVar116._12_2_ = auVar113._6_2_;
  auVar116._14_2_ = auVar129._6_2_;
  auVar115._12_4_ = auVar116._12_4_;
  auVar115._0_10_ = auVar113._0_10_;
  auVar115._10_2_ = auVar129._4_2_;
  auVar114._10_6_ = auVar115._10_6_;
  auVar114._0_8_ = auVar113._0_8_;
  auVar114._8_2_ = auVar113._4_2_;
  auVar70._4_8_ = auVar114._8_8_;
  auVar70._2_2_ = auVar129._2_2_;
  auVar70._0_2_ = auVar113._2_2_;
  *(ulong *)(s + -2) =
       CONCAT44(CONCAT22(auVar129._0_2_,auVar113._0_2_),CONCAT22(auVar98._0_2_,auVar123._0_2_));
  *(ulong *)(s + (long)p + -2) = CONCAT44(auVar70._0_4_,auVar69._0_4_);
  *(ulong *)(s + (long)(p * 2) + -2) = CONCAT44(auVar114._8_4_,auVar108._8_4_);
  uVar105 = CONCAT44(auVar115._12_4_,auVar109._12_4_);
  *(undefined8 *)(s + (long)(p * 3) + -2) = uVar105;
  uVar90 = CONCAT22(auVar98._8_2_,auVar123._8_2_);
  auVar91._0_8_ = CONCAT26(auVar98._10_2_,CONCAT24(auVar123._10_2_,uVar90));
  auVar91._8_2_ = auVar123._12_2_;
  auVar91._10_2_ = auVar98._12_2_;
  auVar101._12_2_ = auVar123._14_2_;
  auVar101._0_12_ = auVar91;
  auVar101._14_2_ = auVar98._14_2_;
  uVar86 = CONCAT22(auVar129._8_2_,auVar113._8_2_);
  auVar87._0_8_ = CONCAT26(auVar129._10_2_,CONCAT24(auVar113._10_2_,uVar86));
  auVar87._8_2_ = auVar113._12_2_;
  auVar87._10_2_ = auVar129._12_2_;
  auVar107._12_2_ = auVar113._14_2_;
  auVar107._0_12_ = auVar87;
  auVar107._14_2_ = auVar129._14_2_;
  *(ulong *)(s + (long)(p * 4) + -2) = CONCAT44(uVar86,uVar90);
  *(ulong *)(s + (long)(p * 5) + -2) =
       CONCAT44((int)((ulong)auVar87._0_8_ >> 0x20),(int)((ulong)auVar91._0_8_ >> 0x20));
  *(ulong *)(s + (long)(p * 6) + -2) = CONCAT44(auVar87._8_4_,auVar91._8_4_);
  *(ulong *)(s + (long)(p * 7) + -2) = CONCAT44(auVar107._12_4_,auVar101._12_4_);
  return;
}

Assistant:

void aom_highbd_lpf_vertical_4_dual_sse2(
    uint16_t *s, int p, const uint8_t *blimit0, const uint8_t *limit0,
    const uint8_t *thresh0, const uint8_t *blimit1, const uint8_t *limit1,
    const uint8_t *thresh1, int bd) {
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;
  __m128i ps[2], qs[2];

  x0 = _mm_loadl_epi64((__m128i *)(s - 2 + 0 * p));
  x1 = _mm_loadl_epi64((__m128i *)(s - 2 + 1 * p));
  x2 = _mm_loadl_epi64((__m128i *)(s - 2 + 2 * p));
  x3 = _mm_loadl_epi64((__m128i *)(s - 2 + 3 * p));
  x4 = _mm_loadl_epi64((__m128i *)(s - 2 + 4 * p));
  x5 = _mm_loadl_epi64((__m128i *)(s - 2 + 5 * p));
  x6 = _mm_loadl_epi64((__m128i *)(s - 2 + 6 * p));
  x7 = _mm_loadl_epi64((__m128i *)(s - 2 + 7 * p));

  highbd_transpose8x8_low_sse2(&x0, &x1, &x2, &x3, &x4, &x5, &x6, &x7, &d0, &d1,
                               &d2, &d3);

  highbd_lpf_internal_4_dual_sse2(&d0, &d1, &d2, &d3, ps, qs, blimit0, limit0,
                                  thresh0, blimit1, limit1, thresh1, bd);

  highbd_transpose4x8_8x4_sse2(&ps[1], &ps[0], &qs[0], &qs[1], &d0, &d1, &d2,
                               &d3, &d4, &d5, &d6, &d7);

  _mm_storel_epi64((__m128i *)(s - 2 + 0 * p), d0);
  _mm_storel_epi64((__m128i *)(s - 2 + 1 * p), d1);
  _mm_storel_epi64((__m128i *)(s - 2 + 2 * p), d2);
  _mm_storel_epi64((__m128i *)(s - 2 + 3 * p), d3);
  _mm_storel_epi64((__m128i *)(s - 2 + 4 * p), d4);
  _mm_storel_epi64((__m128i *)(s - 2 + 5 * p), d5);
  _mm_storel_epi64((__m128i *)(s - 2 + 6 * p), d6);
  _mm_storel_epi64((__m128i *)(s - 2 + 7 * p), d7);
}